

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

string * __thiscall
spvtools::spvInstructionBinaryToText_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,spv_target_env env,uint32_t *instCode,
          size_t instWordCount,uint32_t *code,size_t wordCount,uint32_t options)

{
  bool bVar1;
  spv_result_t sVar2;
  uint uVar3;
  pointer this_00;
  char *pcVar4;
  undefined4 in_register_00000014;
  spv_text local_348;
  spv_text text;
  WrappedDisassembler wrapped;
  undefined1 local_308 [8];
  Disassembler disassembler;
  unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
  local_98;
  undefined1 local_90 [8];
  NameMapper name_mapper;
  unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
  friendly_mapper;
  undefined1 local_60 [8];
  AssemblyGrammar grammar;
  spv_context context;
  size_t wordCount_local;
  uint32_t *code_local;
  size_t instWordCount_local;
  uint32_t *instCode_local;
  string *psStack_10;
  spv_target_env env_local;
  string *output;
  
  instWordCount_local = CONCAT44(in_register_00000014,env);
  instCode_local._4_4_ = (spv_target_env)this;
  context = (spv_context)code;
  wordCount_local = instWordCount;
  code_local = instCode;
  psStack_10 = __return_storage_ptr__;
  grammar.extInstTable_ = (spv_ext_inst_table)spvContextCreate(instCode_local._4_4_);
  AssemblyGrammar::AssemblyGrammar
            ((AssemblyGrammar *)local_60,(spv_const_context)grammar.extInstTable_);
  bVar1 = AssemblyGrammar::isValid((AssemblyGrammar *)local_60);
  if (bVar1) {
    std::unique_ptr<spvtools::FriendlyNameMapper,std::default_delete<spvtools::FriendlyNameMapper>>
    ::unique_ptr<std::default_delete<spvtools::FriendlyNameMapper>,void>
              ((unique_ptr<spvtools::FriendlyNameMapper,std::default_delete<spvtools::FriendlyNameMapper>>
                *)&name_mapper._M_invoker);
    GetTrivialNameMapper_abi_cxx11_();
    if ((wordCount & 0x40) != 0) {
      MakeUnique<spvtools::FriendlyNameMapper,spv_context_t*&,unsigned_int_const*&,unsigned_long_const&>
                ((spvtools *)&local_98,(spv_context_t **)&grammar.extInstTable_,
                 (uint **)&wordCount_local,(unsigned_long *)&context);
      std::
      unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
      operator=((unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                 *)&name_mapper._M_invoker,&local_98);
      std::
      unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
      ~unique_ptr(&local_98);
      this_00 = std::
                unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                ::operator->((unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                              *)&name_mapper._M_invoker);
      FriendlyNameMapper::GetNameMapper_abi_cxx11_
                ((NameMapper *)
                 &disassembler.current_function_cfg_.blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)local_90,
                  (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&disassembler.current_function_cfg_.blocks.
                      super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&disassembler.current_function_cfg_.blocks.
                      super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                *)&wrapped.word_count_,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                *)local_90);
    anon_unknown_0::Disassembler::Disassembler
              ((Disassembler *)local_308,(AssemblyGrammar *)local_60,(uint32_t)wordCount,
               (NameMapper *)&wrapped.word_count_);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                 *)&wrapped.word_count_);
    anon_unknown_0::WrappedDisassembler::WrappedDisassembler
              ((WrappedDisassembler *)&text,(Disassembler *)local_308,
               (uint32_t *)instWordCount_local,(size_t)code_local);
    spvBinaryParse((spv_const_context)grammar.extInstTable_,&text,(uint32_t *)wordCount_local,
                   (size_t)context,anon_unknown_0::DisassembleTargetHeader,
                   anon_unknown_0::DisassembleTargetInstruction,(spv_diagnostic *)0x0);
    local_348 = (spv_text)0x0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    sVar2 = anon_unknown_0::Disassembler::SaveTextResult((Disassembler *)local_308,&local_348);
    if (sVar2 == SPV_SUCCESS) {
      std::__cxx11::string::assign<char_const*,void>
                ((string *)__return_storage_ptr__,local_348->str,local_348->str + local_348->length)
      ;
      while( true ) {
        uVar3 = std::__cxx11::string::empty();
        bVar1 = false;
        if ((uVar3 & 1) == 0) {
          pcVar4 = (char *)std::__cxx11::string::back();
          bVar1 = *pcVar4 == '\n';
        }
        if (!bVar1) break;
        std::__cxx11::string::pop_back();
      }
    }
    spvTextDestroy(local_348);
    spvContextDestroy((spv_context)grammar.extInstTable_);
    anon_unknown_0::Disassembler::~Disassembler((Disassembler *)local_308);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                 *)local_90);
    std::
    unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
    ~unique_ptr((unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                 *)&name_mapper._M_invoker);
  }
  else {
    spvContextDestroy((spv_context)grammar.extInstTable_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",
               (allocator<char> *)
               ((long)&friendly_mapper._M_t.
                       super___uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::FriendlyNameMapper_*,_std::default_delete<spvtools::FriendlyNameMapper>_>
                       .super__Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false>._M_head_impl +
               7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&friendly_mapper._M_t.
                       super___uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::FriendlyNameMapper_*,_std::default_delete<spvtools::FriendlyNameMapper>_>
                       .super__Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false>._M_head_impl +
               7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string spvInstructionBinaryToText(const spv_target_env env,
                                       const uint32_t* instCode,
                                       const size_t instWordCount,
                                       const uint32_t* code,
                                       const size_t wordCount,
                                       const uint32_t options) {
  spv_context context = spvContextCreate(env);
  const AssemblyGrammar grammar(context);
  if (!grammar.isValid()) {
    spvContextDestroy(context);
    return "";
  }

  // Generate friendly names for Ids if requested.
  std::unique_ptr<FriendlyNameMapper> friendly_mapper;
  NameMapper name_mapper = GetTrivialNameMapper();
  if (options & SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES) {
    friendly_mapper = MakeUnique<FriendlyNameMapper>(context, code, wordCount);
    name_mapper = friendly_mapper->GetNameMapper();
  }

  // Now disassemble!
  Disassembler disassembler(grammar, options, name_mapper);
  WrappedDisassembler wrapped(&disassembler, instCode, instWordCount);
  spvBinaryParse(context, &wrapped, code, wordCount, DisassembleTargetHeader,
                 DisassembleTargetInstruction, nullptr);

  spv_text text = nullptr;
  std::string output;
  if (disassembler.SaveTextResult(&text) == SPV_SUCCESS) {
    output.assign(text->str, text->str + text->length);
    // Drop trailing newline characters.
    while (!output.empty() && output.back() == '\n') output.pop_back();
  }
  spvTextDestroy(text);
  spvContextDestroy(context);

  return output;
}